

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

AliasRet aa_table(jit_State *J,IRRef ta,IRRef tb)

{
  IRIns *pIVar1;
  IRIns *pIVar2;
  IRIns *pIVar3;
  IRIns *pIVar4;
  byte bVar5;
  byte bVar6;
  
  pIVar1 = (J->cur).ir;
  bVar5 = *(char *)((long)pIVar1 + (ulong)ta * 8 + 5) + 0xaf;
  bVar6 = *(char *)((long)pIVar1 + (ulong)tb * 8 + 5) + 0xaf;
  if (1 < (bVar6 | bVar5)) {
    pIVar4 = pIVar1 + ta;
    pIVar3 = pIVar1 + tb;
    if ((1 < bVar6) && (pIVar3 = pIVar4, pIVar4 = pIVar1 + tb, 1 < bVar5)) {
      return ALIAS_MAY;
    }
    pIVar2 = pIVar3 + 1;
    if (pIVar2 < pIVar4) {
      do {
        if (((uint)(pIVar2->field_0).op2 == (uint)((ulong)((long)pIVar3 - (long)pIVar1) >> 3)) &&
           ((byte)((pIVar2->field_1).o + 0xb6) < 4)) {
          return ALIAS_MAY;
        }
        pIVar2 = pIVar2 + 1;
      } while (pIVar2 < pIVar4);
    }
  }
  return ALIAS_NO;
}

Assistant:

static AliasRet aa_table(jit_State *J, IRRef ta, IRRef tb)
{
  IRIns *taba = IR(ta), *tabb = IR(tb);
  int newa, newb;
  lj_assertJ(ta != tb, "bad usage");
  lj_assertJ(irt_istab(taba->t) && irt_istab(tabb->t), "bad usage");
  /* Disambiguate new allocations. */
  newa = (taba->o == IR_TNEW || taba->o == IR_TDUP);
  newb = (tabb->o == IR_TNEW || tabb->o == IR_TDUP);
  if (newa && newb)
    return ALIAS_NO;  /* Two different allocations never alias. */
  if (newb) {  /* At least one allocation? */
    IRIns *tmp = taba; taba = tabb; tabb = tmp;
  } else if (!newa) {
    return ALIAS_MAY;  /* Anything else: we just don't know. */
  }
  return aa_escape(J, taba, tabb);
}